

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O1

void __thiscall
FDrawInfo::AddUpperMissingTexture(FDrawInfo *this,side_t *side,subsector_t *sub,float Backheight)

{
  uint *puVar1;
  uint uVar2;
  seg_t *psVar3;
  MissingSegInfo *pMVar4;
  MissingTextureInfo *pMVar5;
  MissingTextureInfo *pMVar6;
  MissingTextureInfo *pMVar7;
  long lVar8;
  uint uVar9;
  bool bVar10;
  
  if (((*side->segs)->backsector != (sector_t *)0x0) && (0 < side->numsegs)) {
    lVar8 = 0;
    do {
      psVar3 = side->segs[lVar8];
      if (psVar3->Subsector == sub) {
        if (sub->render_sector != sub->sector) {
          return;
        }
        if (psVar3->frontsector != sub->sector) {
          return;
        }
        uVar2 = (this->MissingUpperTextures).Count;
        bVar10 = uVar2 != 0;
        if (bVar10) {
          pMVar7 = (this->MissingUpperTextures).Array;
          if (pMVar7->sub == sub) {
            uVar9 = 0;
          }
          else {
            uVar9 = 0;
            pMVar6 = pMVar7;
            do {
              if (uVar2 - 1 == uVar9) goto LAB_004478b6;
              pMVar7 = pMVar6 + 1;
              uVar9 = uVar9 + 1;
              pMVar5 = pMVar6 + 1;
              pMVar6 = pMVar7;
            } while (pMVar5->sub != sub);
            bVar10 = uVar9 < uVar2;
          }
          if (Backheight < pMVar7->Planez) {
            pMVar7->Planez = Backheight;
            pMVar7->seg = psVar3;
          }
          TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Grow
                    (&this->MissingUpperSegs,1);
          pMVar4 = (this->MissingUpperSegs).Array;
          uVar2 = (this->MissingUpperSegs).Count;
          pMVar4[uVar2].seg = psVar3;
          pMVar4[uVar2].MTI_Index = uVar9;
          puVar1 = &(this->MissingUpperSegs).Count;
          *puVar1 = *puVar1 + 1;
          if (bVar10) {
            return;
          }
        }
LAB_004478b6:
        TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Grow
                  (&this->MissingUpperTextures,1);
        pMVar7 = (this->MissingUpperTextures).Array;
        uVar2 = (this->MissingUpperTextures).Count;
        pMVar7[uVar2].seg = psVar3;
        pMVar7[uVar2].sub = sub;
        pMVar7[uVar2].Planez = Backheight;
        pMVar7[uVar2].Planezfront = 0.0;
        (this->MissingUpperTextures).Count = uVar2 + 1;
        TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Grow
                  (&this->MissingUpperSegs,1);
        pMVar4 = (this->MissingUpperSegs).Array;
        uVar9 = (this->MissingUpperSegs).Count;
        pMVar4[uVar9].seg = psVar3;
        pMVar4[uVar9].MTI_Index = uVar2;
        puVar1 = &(this->MissingUpperSegs).Count;
        *puVar1 = *puVar1 + 1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < side->numsegs);
  }
  return;
}

Assistant:

void FDrawInfo::AddUpperMissingTexture(side_t * side, subsector_t *sub, float Backheight)
{
	if (!side->segs[0]->backsector) return;

	totalms.Clock();
	for (int i = 0; i < side->numsegs; i++)
	{
		seg_t *seg = side->segs[i];

		// we need find the seg belonging to the passed subsector
		if (seg->Subsector == sub)
		{
			MissingTextureInfo mti = {};
			MissingSegInfo msi;


			if (sub->render_sector != sub->sector || seg->frontsector != sub->sector)
			{
				totalms.Unclock();
				return;
			}

			for (unsigned int i = 0; i < MissingUpperTextures.Size(); i++)
			{
				if (MissingUpperTextures[i].sub == sub)
				{
					// Use the lowest adjoining height to draw a fake ceiling if necessary
					if (Backheight < MissingUpperTextures[i].Planez)
					{
						MissingUpperTextures[i].Planez = Backheight;
						MissingUpperTextures[i].seg = seg;
					}

					msi.MTI_Index = i;
					msi.seg = seg;
					MissingUpperSegs.Push(msi);
					totalms.Unclock();
					return;
				}
			}
			mti.seg = seg;
			mti.sub = sub;
			mti.Planez = Backheight;
			msi.MTI_Index = MissingUpperTextures.Push(mti);
			msi.seg = seg;
			MissingUpperSegs.Push(msi);
		}
	}
	totalms.Unclock();
}